

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fStencilTexturingTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_1::genTestRects
               (vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *rects,int width,
               int height)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  Vector<int,_4> local_40;
  
  local_40.m_data[0] = 0;
  local_40.m_data[1] = 0;
  local_40.m_data[2] = width;
  local_40.m_data[3] = height;
  std::vector<tcu::Vector<int,4>,std::allocator<tcu::Vector<int,4>>>::
  emplace_back<tcu::Vector<int,4>>
            ((vector<tcu::Vector<int,4>,std::allocator<tcu::Vector<int,4>>> *)rects,&local_40);
  bVar4 = width == 1;
  if (!bVar4 || height != 1) {
    bVar1 = 0;
    iVar3 = height;
    iVar2 = width;
    do {
      if ((iVar3 < 2) || ((bool)(~bVar4 & bVar1))) {
        iVar2 = iVar2 + -1;
      }
      else {
        iVar3 = iVar3 + -1;
      }
      bVar1 = bVar1 ^ 1;
      local_40.m_data[1] = height - iVar3;
      local_40.m_data[0] = width - iVar2;
      local_40.m_data[2] = iVar2;
      local_40.m_data[3] = iVar3;
      std::vector<tcu::Vector<int,4>,std::allocator<tcu::Vector<int,4>>>::
      emplace_back<tcu::Vector<int,4>>
                ((vector<tcu::Vector<int,4>,std::allocator<tcu::Vector<int,4>>> *)rects,&local_40);
      bVar4 = iVar2 == 1;
    } while (iVar3 != 1 || iVar2 != 1);
  }
  return;
}

Assistant:

static void genTestRects (vector<IVec4>& rects, int width, int height)
{
	int curWidth	= width;
	int curHeight	= height;
	int ndx			= 0;

	for (;;)
	{
		rects.push_back(IVec4(width-curWidth, height-curHeight, curWidth, curHeight));

		DE_ASSERT(curWidth >= 1 && curHeight >= 1);
		if (curWidth == 1 && curHeight == 1)
			break;
		else if (curHeight > 1 && ((ndx%2) == 0 || curWidth == 1))
			curHeight -= 1;
		else
			curWidth -= 1;

		ndx += 1;
	}
}